

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int __thiscall
kj::ArrayBuilder<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_>::truncate
          (ArrayBuilder<kj::_::Tuple<kj::String,_kj::Array<unsigned_long>_>_> *this,char *__file,
          __off_t __length)

{
  Tuple<kj::String,_kj::Array<unsigned_long>_> *pTVar1;
  Tuple<kj::String,_kj::Array<unsigned_long>_> *pTVar2;
  Tuple<kj::String,_kj::Array<unsigned_long>_> *pTVar3;
  unsigned_long *puVar4;
  size_t sVar5;
  ArrayDisposer *pAVar6;
  char *pcVar7;
  int in_EAX;
  
  pTVar2 = this->ptr;
  pTVar3 = this->pos;
  while (pTVar2 + (long)__file < pTVar3) {
    pTVar1 = pTVar3 + -1;
    this->pos = pTVar1;
    puVar4 = pTVar3[-1].impl.super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.ptr;
    if (puVar4 != (unsigned_long *)0x0) {
      sVar5 = pTVar3[-1].impl.super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.size_;
      pTVar3[-1].impl.super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.ptr =
           (unsigned_long *)0x0;
      pTVar3[-1].impl.super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.size_ = 0;
      pAVar6 = pTVar3[-1].impl.super_TupleElement<1U,_kj::Array<unsigned_long>_>.value.disposer;
      in_EAX = (**pAVar6->_vptr_ArrayDisposer)(pAVar6,puVar4,8,sVar5,sVar5,0);
    }
    pcVar7 = (pTVar1->impl).super_TupleElement<0U,_kj::String>.value.content.ptr;
    if (pcVar7 != (char *)0x0) {
      sVar5 = pTVar3[-1].impl.super_TupleElement<0U,_kj::String>.value.content.size_;
      (pTVar1->impl).super_TupleElement<0U,_kj::String>.value.content.ptr = (char *)0x0;
      pTVar3[-1].impl.super_TupleElement<0U,_kj::String>.value.content.size_ = 0;
      pAVar6 = pTVar3[-1].impl.super_TupleElement<0U,_kj::String>.value.content.disposer;
      in_EAX = (**pAVar6->_vptr_ArrayDisposer)(pAVar6,pcVar7,1,sVar5,sVar5);
    }
    pTVar3 = this->pos;
  }
  return in_EAX;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }